

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObject
          (ShadingWriter *this,PDFMatrix *inShadingMatrix,ObjectIDType inPatternObjectId,
          ObjectIDType *outShadingObjectId)

{
  IndirectObjectsReferenceRegistry *this_00;
  DictionaryContext *pDVar1;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  DictionaryContext *local_48;
  DictionaryContext *patternDict;
  ObjectIDType OStack_38;
  EStatusCode status;
  ObjectIDType shadingObjectId;
  ObjectIDType *outShadingObjectId_local;
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inShadingMatrix_local;
  ShadingWriter *this_local;
  
  shadingObjectId = (ObjectIDType)outShadingObjectId;
  outShadingObjectId_local = (ObjectIDType *)inPatternObjectId;
  inPatternObjectId_local = (ObjectIDType)inShadingMatrix;
  inShadingMatrix_local = (PDFMatrix *)this;
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  OStack_38 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  patternDict._4_4_ =
       ObjectsContext::StartNewIndirectObject
                 (this->mObjectsContext,(ObjectIDType)outShadingObjectId_local);
  this_local._4_4_ = patternDict._4_4_;
  if (patternDict._4_4_ == eSuccess) {
    pDVar1 = ObjectsContext::StartDictionary(this->mObjectsContext);
    local_48 = pDVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Type",&local_69);
    DictionaryContext::WriteKey(pDVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    pDVar1 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Pattern",&local_a1);
    DictionaryContext::WriteNameValue(pDVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    pDVar1 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"PatternType",&local_c9);
    DictionaryContext::WriteKey(pDVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    DictionaryContext::WriteIntegerValue(local_48,2);
    pDVar1 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Matrix",&local_f1);
    DictionaryContext::WriteKey(pDVar1,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    ObjectsContext::StartArray(this->mObjectsContext);
    ObjectsContext::WriteDouble
              (this->mObjectsContext,*(double *)inPatternObjectId_local,eTokenSeparatorSpace);
    ObjectsContext::WriteDouble
              (this->mObjectsContext,*(double *)(inPatternObjectId_local + 8),eTokenSeparatorSpace);
    ObjectsContext::WriteDouble
              (this->mObjectsContext,*(double *)(inPatternObjectId_local + 0x10),
               eTokenSeparatorSpace);
    ObjectsContext::WriteDouble
              (this->mObjectsContext,*(double *)(inPatternObjectId_local + 0x18),
               eTokenSeparatorSpace);
    ObjectsContext::WriteDouble
              (this->mObjectsContext,*(double *)(inPatternObjectId_local + 0x20),
               eTokenSeparatorSpace);
    ObjectsContext::WriteDouble
              (this->mObjectsContext,*(double *)(inPatternObjectId_local + 0x28),
               eTokenSeparatorSpace);
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
    pDVar1 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Shading",&local_119);
    DictionaryContext::WriteKey(pDVar1,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    DictionaryContext::WriteNewObjectReferenceValue(local_48,OStack_38);
    patternDict._4_4_ = ObjectsContext::EndDictionary(this->mObjectsContext,local_48);
    if (patternDict._4_4_ == eSuccess) {
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
    }
    *(ObjectIDType *)shadingObjectId = OStack_38;
    this_local._4_4_ = patternDict._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode ShadingWriter::WriteShadingPatternObject(
    const PDFMatrix& inShadingMatrix,
    ObjectIDType inPatternObjectId,
    ObjectIDType& outShadingObjectId
) {
    ObjectIDType shadingObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

    EStatusCode status = mObjectsContext->StartNewIndirectObject(inPatternObjectId);
    if(status != eSuccess)
        return status;
    DictionaryContext* patternDict = mObjectsContext->StartDictionary();
    patternDict->WriteKey("Type");
    patternDict->WriteNameValue("Pattern");
    patternDict->WriteKey("PatternType");
    patternDict->WriteIntegerValue(2);
    patternDict->WriteKey("Matrix");
    mObjectsContext->StartArray();
    mObjectsContext->WriteDouble(inShadingMatrix.a);
    mObjectsContext->WriteDouble(inShadingMatrix.b);
    mObjectsContext->WriteDouble(inShadingMatrix.c);
    mObjectsContext->WriteDouble(inShadingMatrix.d);
    mObjectsContext->WriteDouble(inShadingMatrix.e);
    mObjectsContext->WriteDouble(inShadingMatrix.f);
    mObjectsContext->EndArray(eTokenSeparatorEndLine);
    patternDict->WriteKey("Shading");
    patternDict->WriteNewObjectReferenceValue(shadingObjectId);
    status = mObjectsContext->EndDictionary(patternDict);
    if(eSuccess == status)
        mObjectsContext->EndIndirectObject();

    outShadingObjectId = shadingObjectId;

    return status;
}